

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImDrawList::PathRect(ImDrawList *this,ImVec2 *a,ImVec2 *b,float rounding,ImDrawFlags flags)

{
  ImVec2 *pIVar1;
  uint uVar2;
  ImVec2 *pIVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float radius;
  ImVec2 local_38;
  
  if (flags == -1) {
    uVar4 = 0xf0;
  }
  else if (flags - 1U < 0xf) {
    uVar4 = flags << 4;
  }
  else {
    if ((flags & 0xfU) != 0) {
      __assert_fail("(flags & 0x0F) == 0 && \"Misuse of legacy hardcoded ImDrawCornerFlags values!\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui_draw.cpp"
                    ,0x545,"ImDrawFlags FixRectCornerFlags(ImDrawFlags)");
    }
    uVar4 = flags | 0xf0;
    if ((flags & 0x1f0U) != 0) {
      uVar4 = flags;
    }
  }
  uVar2 = ~uVar4;
  fVar9 = 0.5;
  if ((uVar2 & 0xc0) != 0) {
    fVar9 = 1.0;
  }
  fVar10 = 0.5;
  if ((uVar2 & 0x30) != 0) {
    fVar10 = fVar9;
  }
  fVar9 = 0.5;
  if ((uVar2 & 0xa0) != 0) {
    fVar9 = 1.0;
  }
  fVar8 = 0.5;
  if ((uVar2 & 0x50) != 0) {
    fVar8 = fVar9;
  }
  if ((uVar4 & 0x1f0) != 0x100) {
    fVar9 = ABS(b->x - a->x) * fVar10 + -1.0;
    if (fVar9 <= rounding) {
      rounding = fVar9;
    }
    fVar9 = ABS(b->y - a->y) * fVar8 + -1.0;
    if (fVar9 <= rounding) {
      rounding = fVar9;
    }
    if (0.0 < rounding) {
      fVar9 = 0.0;
      if ((uVar4 & 0x10) != 0) {
        fVar9 = rounding;
      }
      fVar10 = 0.0;
      if ((uVar4 & 0x20) != 0) {
        fVar10 = rounding;
      }
      fVar8 = 0.0;
      if ((char)uVar4 < '\0') {
        fVar8 = rounding;
      }
      radius = 0.0;
      if ((uVar4 & 0x40) != 0) {
        radius = rounding;
      }
      local_38.x = a->x + fVar9;
      local_38.y = a->y + fVar9;
      PathArcToFast(this,&local_38,fVar9,6,9);
      local_38.x = b->x - fVar10;
      local_38.y = a->y + fVar10;
      PathArcToFast(this,&local_38,fVar10,9,0xc);
      local_38.x = b->x - fVar8;
      local_38.y = b->y - fVar8;
      PathArcToFast(this,&local_38,fVar8,0,3);
      local_38.x = a->x + radius;
      local_38.y = b->y - radius;
      PathArcToFast(this,&local_38,radius,3,6);
      return;
    }
  }
  iVar6 = (this->_Path).Size;
  iVar7 = (this->_Path).Capacity;
  if (iVar6 == iVar7) {
    iVar6 = iVar6 + 1;
    if (iVar7 == 0) {
      iVar5 = 8;
    }
    else {
      iVar5 = iVar7 / 2 + iVar7;
    }
    if (iVar6 < iVar5) {
      iVar6 = iVar5;
    }
    if (iVar7 < iVar6) {
      pIVar3 = (ImVec2 *)ImGui::MemAlloc((long)iVar6 << 3);
      pIVar1 = (this->_Path).Data;
      if (pIVar1 != (ImVec2 *)0x0) {
        memcpy(pIVar3,pIVar1,(long)(this->_Path).Size << 3);
        ImGui::MemFree((this->_Path).Data);
      }
      (this->_Path).Data = pIVar3;
      (this->_Path).Capacity = iVar6;
    }
  }
  (this->_Path).Data[(this->_Path).Size] = *a;
  iVar7 = (this->_Path).Size;
  iVar5 = (this->_Path).Capacity;
  iVar6 = iVar7 + 1;
  (this->_Path).Size = iVar6;
  fVar9 = b->x;
  fVar10 = a->y;
  if (iVar6 == iVar5) {
    iVar7 = iVar7 + 2;
    if (iVar5 == 0) {
      iVar6 = 8;
    }
    else {
      iVar6 = iVar5 / 2 + iVar5;
    }
    if (iVar7 < iVar6) {
      iVar7 = iVar6;
    }
    if (iVar5 < iVar7) {
      pIVar3 = (ImVec2 *)ImGui::MemAlloc((long)iVar7 << 3);
      pIVar1 = (this->_Path).Data;
      if (pIVar1 != (ImVec2 *)0x0) {
        memcpy(pIVar3,pIVar1,(long)(this->_Path).Size << 3);
        ImGui::MemFree((this->_Path).Data);
      }
      (this->_Path).Data = pIVar3;
      (this->_Path).Capacity = iVar7;
    }
  }
  pIVar1 = (this->_Path).Data;
  iVar6 = (this->_Path).Size;
  pIVar1[iVar6].x = fVar9;
  pIVar1[iVar6].y = fVar10;
  iVar7 = (this->_Path).Size;
  iVar5 = (this->_Path).Capacity;
  iVar6 = iVar7 + 1;
  (this->_Path).Size = iVar6;
  if (iVar6 == iVar5) {
    iVar7 = iVar7 + 2;
    if (iVar5 == 0) {
      iVar6 = 8;
    }
    else {
      iVar6 = iVar5 / 2 + iVar5;
    }
    if (iVar7 < iVar6) {
      iVar7 = iVar6;
    }
    if (iVar5 < iVar7) {
      pIVar3 = (ImVec2 *)ImGui::MemAlloc((long)iVar7 << 3);
      pIVar1 = (this->_Path).Data;
      if (pIVar1 != (ImVec2 *)0x0) {
        memcpy(pIVar3,pIVar1,(long)(this->_Path).Size << 3);
        ImGui::MemFree((this->_Path).Data);
      }
      (this->_Path).Data = pIVar3;
      (this->_Path).Capacity = iVar7;
    }
  }
  (this->_Path).Data[(this->_Path).Size] = *b;
  iVar7 = (this->_Path).Size;
  iVar5 = (this->_Path).Capacity;
  iVar6 = iVar7 + 1;
  (this->_Path).Size = iVar6;
  fVar9 = a->x;
  fVar10 = b->y;
  if (iVar6 == iVar5) {
    iVar7 = iVar7 + 2;
    if (iVar5 == 0) {
      iVar6 = 8;
    }
    else {
      iVar6 = iVar5 / 2 + iVar5;
    }
    if (iVar7 < iVar6) {
      iVar7 = iVar6;
    }
    if (iVar5 < iVar7) {
      pIVar3 = (ImVec2 *)ImGui::MemAlloc((long)iVar7 << 3);
      pIVar1 = (this->_Path).Data;
      if (pIVar1 != (ImVec2 *)0x0) {
        memcpy(pIVar3,pIVar1,(long)(this->_Path).Size << 3);
        ImGui::MemFree((this->_Path).Data);
      }
      (this->_Path).Data = pIVar3;
      (this->_Path).Capacity = iVar7;
    }
  }
  pIVar1 = (this->_Path).Data;
  iVar6 = (this->_Path).Size;
  pIVar1[iVar6].x = fVar9;
  pIVar1[iVar6].y = fVar10;
  (this->_Path).Size = (this->_Path).Size + 1;
  return;
}

Assistant:

void ImDrawList::PathRect(const ImVec2& a, const ImVec2& b, float rounding, ImDrawFlags flags)
{
    flags = FixRectCornerFlags(flags);
    rounding = ImMin(rounding, ImFabs(b.x - a.x) * ( ((flags & ImDrawFlags_RoundCornersTop)  == ImDrawFlags_RoundCornersTop)  || ((flags & ImDrawFlags_RoundCornersBottom) == ImDrawFlags_RoundCornersBottom) ? 0.5f : 1.0f ) - 1.0f);
    rounding = ImMin(rounding, ImFabs(b.y - a.y) * ( ((flags & ImDrawFlags_RoundCornersLeft) == ImDrawFlags_RoundCornersLeft) || ((flags & ImDrawFlags_RoundCornersRight)  == ImDrawFlags_RoundCornersRight)  ? 0.5f : 1.0f ) - 1.0f);

    if (rounding <= 0.0f || (flags & ImDrawFlags_RoundCornersMask_) == ImDrawFlags_RoundCornersNone)
    {
        PathLineTo(a);
        PathLineTo(ImVec2(b.x, a.y));
        PathLineTo(b);
        PathLineTo(ImVec2(a.x, b.y));
    }
    else
    {
        const float rounding_tl = (flags & ImDrawFlags_RoundCornersTopLeft)     ? rounding : 0.0f;
        const float rounding_tr = (flags & ImDrawFlags_RoundCornersTopRight)    ? rounding : 0.0f;
        const float rounding_br = (flags & ImDrawFlags_RoundCornersBottomRight) ? rounding : 0.0f;
        const float rounding_bl = (flags & ImDrawFlags_RoundCornersBottomLeft)  ? rounding : 0.0f;
        PathArcToFast(ImVec2(a.x + rounding_tl, a.y + rounding_tl), rounding_tl, 6, 9);
        PathArcToFast(ImVec2(b.x - rounding_tr, a.y + rounding_tr), rounding_tr, 9, 12);
        PathArcToFast(ImVec2(b.x - rounding_br, b.y - rounding_br), rounding_br, 0, 3);
        PathArcToFast(ImVec2(a.x + rounding_bl, b.y - rounding_bl), rounding_bl, 3, 6);
    }
}